

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitYUV(VP8Io *io,WebPDecParams *p)

{
  int dst_stride;
  int iVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  long lVar6;
  int width;
  int height;
  
  pWVar3 = p->output;
  dst_stride = (pWVar3->u).YUVA.y_stride;
  lVar6 = (long)(io->mb_y >> 1);
  iVar1 = (pWVar3->u).YUVA.u_stride;
  puVar4 = (pWVar3->u).YUVA.u;
  iVar2 = (pWVar3->u).YUVA.v_stride;
  puVar5 = (pWVar3->u).YUVA.v;
  width = (io->mb_w + 1) / 2;
  height = (io->mb_h + 1) / 2;
  WebPCopyPlane(io->y,io->y_stride,(pWVar3->u).RGBA.rgba + (long)dst_stride * (long)io->mb_y,
                dst_stride,io->mb_w,io->mb_h);
  WebPCopyPlane(io->u,io->uv_stride,puVar4 + iVar1 * lVar6,(pWVar3->u).YUVA.u_stride,width,height);
  WebPCopyPlane(io->v,io->uv_stride,puVar5 + iVar2 * lVar6,(pWVar3->u).YUVA.v_stride,width,height);
  return io->mb_h;
}

Assistant:

static int EmitYUV(const VP8Io* const io, WebPDecParams* const p) {
  WebPDecBuffer* output = p->output;
  const WebPYUVABuffer* const buf = &output->u.YUVA;
  uint8_t* const y_dst = buf->y + (size_t)io->mb_y * buf->y_stride;
  uint8_t* const u_dst = buf->u + (size_t)(io->mb_y >> 1) * buf->u_stride;
  uint8_t* const v_dst = buf->v + (size_t)(io->mb_y >> 1) * buf->v_stride;
  const int mb_w = io->mb_w;
  const int mb_h = io->mb_h;
  const int uv_w = (mb_w + 1) / 2;
  const int uv_h = (mb_h + 1) / 2;
  WebPCopyPlane(io->y, io->y_stride, y_dst, buf->y_stride, mb_w, mb_h);
  WebPCopyPlane(io->u, io->uv_stride, u_dst, buf->u_stride, uv_w, uv_h);
  WebPCopyPlane(io->v, io->uv_stride, v_dst, buf->v_stride, uv_w, uv_h);
  return io->mb_h;
}